

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

String * __thiscall Lexer::describeCurrentPosition(String *__return_storage_ptr__,Lexer *this)

{
  _Elt_pointer pTVar1;
  _Map_pointer ppTVar2;
  _Map_pointer ppTVar3;
  bool bVar4;
  bool bVar5;
  bool local_51;
  String local_50;
  String local_30;
  
  pTVar1 = (this->m_tokenPosition)._M_cur;
  ppTVar2 = (this->m_tokenPosition)._M_node;
  ppTVar3 = (this->m_tokens)._deque.
            super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  bVar4 = ppTVar2 < ppTVar3;
  if (ppTVar2 == ppTVar3) {
    bVar4 = pTVar1 < (this->m_tokens)._deque.
                     super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
  }
  if (bVar4) {
    ppTVar3 = (this->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    bVar5 = ppTVar3 <= ppTVar2;
    if (ppTVar2 == ppTVar3) {
      bVar5 = (this->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur <= pTVar1;
    }
    if (!bVar5) goto LAB_0011f67a;
  }
  else {
LAB_0011f67a:
    if (bVar4) {
      ppTVar3 = (this->m_tokens)._deque.
                super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
                super__Deque_impl_data._M_start._M_node;
      local_50._string._M_dataplus._M_p._0_1_ = ppTVar3 <= ppTVar2;
      if (ppTVar2 == ppTVar3) {
        local_50._string._M_dataplus._M_p._0_1_ =
             (this->m_tokens)._deque.
             super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur <= pTVar1;
      }
    }
    else {
      local_50._string._M_dataplus._M_p._0_1_ = false;
    }
    local_51 = true;
    error<bool,bool>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/lexer.h:86: hasValidToken() (%1) does not equal true (%2)"
                     ,(bool *)&local_50,&local_51);
  }
  String::operator+(&local_30,&((this->m_tokenPosition)._M_cur)->file,":");
  pTVar1 = (this->m_tokenPosition)._M_cur;
  ppTVar2 = (this->m_tokenPosition)._M_node;
  ppTVar3 = (this->m_tokens)._deque.
            super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  bVar4 = ppTVar2 < ppTVar3;
  if (ppTVar2 == ppTVar3) {
    bVar4 = pTVar1 < (this->m_tokens)._deque.
                     super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
  }
  if (bVar4) {
    ppTVar3 = (this->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    bVar5 = ppTVar3 <= ppTVar2;
    if (ppTVar2 == ppTVar3) {
      bVar5 = (this->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur <= pTVar1;
    }
    if (bVar5) goto LAB_0011f742;
  }
  if (bVar4) {
    ppTVar3 = (this->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    local_50._string._M_dataplus._M_p._0_1_ = ppTVar3 <= ppTVar2;
    if (ppTVar2 == ppTVar3) {
      local_50._string._M_dataplus._M_p._0_1_ =
           (this->m_tokens)._deque.
           super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur <= pTVar1;
    }
  }
  else {
    local_50._string._M_dataplus._M_p._0_1_ = false;
  }
  local_51 = true;
  error<bool,bool>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/lexer.h:86: hasValidToken() (%1) does not equal true (%2)"
                   ,(bool *)&local_50,&local_51);
LAB_0011f742:
  String::fromNumber(&local_50,((this->m_tokenPosition)._M_cur)->line);
  String::operator+(__return_storage_ptr__,&local_30,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_50._string._M_dataplus._M_p._1_7_,local_50._string._M_dataplus._M_p._0_1_)
      != &local_50._string.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_50._string._M_dataplus._M_p._1_7_,
                             local_50._string._M_dataplus._M_p._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._string._M_dataplus._M_p != &local_30._string.field_2) {
    operator_delete(local_30._string._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

String Lexer::describeCurrentPosition()
{
	return token()->file + ":" + token()->line;
}